

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

int __thiscall QTreeViewPrivate::viewIndex(QTreeViewPrivate *this,QModelIndex *_index)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  qsizetype qVar5;
  quintptr qVar6;
  int *piVar7;
  const_reference pQVar8;
  quintptr qVar9;
  QModelIndex *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QModelIndex *idx_1;
  int j_1;
  QModelIndex *idx;
  int j;
  QModelIndex *idx2;
  QModelIndex *idx1;
  int i;
  int localCount;
  quintptr internalId;
  int row;
  QModelIndex index;
  int totalCount;
  qsizetype in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int local_8c;
  int local_7c;
  int local_68;
  int local_40;
  int local_3c;
  int local_38 [3];
  int local_2c;
  undefined1 *local_28;
  undefined1 *local_20;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_18;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QModelIndex::isValid
                    ((QModelIndex *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  if ((!bVar1) || (bVar1 = QList<QTreeViewItem>::isEmpty((QList<QTreeViewItem> *)0x8f00e1), bVar1))
  {
    local_40 = -1;
  }
  else {
    qVar5 = QList<QTreeViewItem>::size((QList<QTreeViewItem> *)(in_RDI + 0x3c));
    local_c = (int)qVar5;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::row(in_RSI);
    QModelIndex::sibling(in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
    iVar2 = QModelIndex::row((QModelIndex *)&local_28);
    qVar6 = QModelIndex::internalId((QModelIndex *)&local_28);
    local_2c = in_RDI[0x3d].r + -1;
    local_38[2] = local_c - in_RDI[0x3d].r;
    piVar7 = qMin<int>(&local_2c,local_38 + 2);
    iVar4 = *piVar7;
    for (local_68 = 0; local_68 < iVar4; local_68 = local_68 + 1) {
      pQVar8 = QList<QTreeViewItem>::at
                         ((QList<QTreeViewItem> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          in_stack_ffffffffffffff48);
      iVar3 = QModelIndex::row(&pQVar8->index);
      if ((iVar3 == iVar2) && (qVar9 = QModelIndex::internalId(&pQVar8->index), qVar9 == qVar6)) {
        in_RDI[0x3d].r = in_RDI[0x3d].r + local_68;
        local_40 = in_RDI[0x3d].r;
        goto LAB_008f045e;
      }
      pQVar8 = QList<QTreeViewItem>::at
                         ((QList<QTreeViewItem> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          in_stack_ffffffffffffff48);
      iVar3 = QModelIndex::row(&pQVar8->index);
      if ((iVar3 == iVar2) && (qVar9 = QModelIndex::internalId(&pQVar8->index), qVar9 == qVar6)) {
        in_RDI[0x3d].r = (in_RDI[0x3d].r - local_68) + -1;
        local_40 = in_RDI[0x3d].r;
        goto LAB_008f045e;
      }
    }
    local_38[1] = 0;
    local_38[0] = in_RDI[0x3d].r + iVar4;
    piVar7 = qMax<int>(local_38 + 1,local_38);
    for (local_7c = *piVar7; local_7c < local_c; local_7c = local_7c + 1) {
      pQVar8 = QList<QTreeViewItem>::at
                         ((QList<QTreeViewItem> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          in_stack_ffffffffffffff48);
      iVar3 = QModelIndex::row(&pQVar8->index);
      if ((iVar3 == iVar2) && (qVar9 = QModelIndex::internalId(&pQVar8->index), qVar9 == qVar6)) {
        in_RDI[0x3d].r = local_7c;
        local_40 = local_7c;
        goto LAB_008f045e;
      }
    }
    local_3c = in_RDI[0x3d].r - iVar4;
    piVar7 = qMin<int>(&local_c,&local_3c);
    local_8c = *piVar7;
    do {
      local_8c = local_8c + -1;
      if (local_8c < 0) {
        local_40 = -1;
        goto LAB_008f045e;
      }
      pQVar8 = QList<QTreeViewItem>::at
                         ((QList<QTreeViewItem> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          in_stack_ffffffffffffff48);
      iVar4 = QModelIndex::row(&pQVar8->index);
    } while ((iVar4 != iVar2) || (qVar9 = QModelIndex::internalId(&pQVar8->index), qVar9 != qVar6));
    in_RDI[0x3d].r = local_8c;
    local_40 = local_8c;
  }
LAB_008f045e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_40;
}

Assistant:

int QTreeViewPrivate::viewIndex(const QModelIndex &_index) const
{
    if (!_index.isValid() || viewItems.isEmpty())
        return -1;

    const int totalCount = viewItems.size();
    const QModelIndex index = _index.sibling(_index.row(), 0);
    const int row = index.row();
    const quintptr internalId = index.internalId();

    // We start nearest to the lastViewedItem
    int localCount = qMin(lastViewedItem - 1, totalCount - lastViewedItem);
    for (int i = 0; i < localCount; ++i) {
        const QModelIndex &idx1 = viewItems.at(lastViewedItem + i).index;
        if (idx1.row() == row && idx1.internalId() == internalId) {
            lastViewedItem = lastViewedItem + i;
            return lastViewedItem;
        }
        const QModelIndex &idx2 = viewItems.at(lastViewedItem - i - 1).index;
        if (idx2.row() == row && idx2.internalId() == internalId) {
            lastViewedItem = lastViewedItem - i - 1;
            return lastViewedItem;
        }
    }

    for (int j = qMax(0, lastViewedItem + localCount); j < totalCount; ++j) {
        const QModelIndex &idx = viewItems.at(j).index;
        if (idx.row() == row && idx.internalId() == internalId) {
            lastViewedItem = j;
            return j;
        }
    }
    for (int j = qMin(totalCount, lastViewedItem - localCount) - 1; j >= 0; --j) {
        const QModelIndex &idx = viewItems.at(j).index;
        if (idx.row() == row && idx.internalId() == internalId) {
            lastViewedItem = j;
            return j;
        }
    }

    // nothing found
    return -1;
}